

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  int x;
  char eme [8];
  
  setlocale(6,anon_var_dwarf_74d + 0x3b);
  builtin_strncpy(eme,"\x1b[1;33m",8);
  std::operator<<((ostream *)&std::cout,eme);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_70b);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_721);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::istream::operator>>((istream *)&std::cin,&x);
  if (x == 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_737);
    std::endl<char,std::char_traits<char>>(poVar1);
    pcVar2 = anon_var_dwarf_74d;
  }
  else {
    pcVar2 = anon_var_dwarf_757;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    char eme[] = {0x1b, '[', '1', ';', '3', '3', 'm', 0};
    cout << eme;

    int x;

    cout << "Você acredita que é capaz de amar o destino que escolheu?" << endl;
    cout << "Digite 1 para sim e 0 para não." << endl;
    cin >> x;

    if (x == 1)
    {
        cout << "Friedrich Nietzsche concorda com você." << endl;
        cout << "Para uma reafirmação disso, leia 'Além do bem e do mal'." << endl;
    }
    else
    {
        cout << "Seria bom começar a viver os pre-socráticos." << endl;
    }

    return 0;
}